

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

int64_t duckdb::ParseInteger(Value *value,string *loption)

{
  vector<duckdb::Value,_true> *this;
  int64_t iVar1;
  BinderException *pBVar2;
  allocator local_79;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  while( true ) {
    if (value->is_null == true) {
      pBVar2 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_78,"\"%s\" expects a non-null integer value",&local_79);
      ::std::__cxx11::string::string((string *)&local_38,(string *)loption);
      BinderException::BinderException<std::__cxx11::string>(pBVar2,&local_78,&local_38);
      __cxa_throw(pBVar2,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((value->type_).id_ != LIST) break;
    this = ListValue::GetChildren(value);
    if ((long)(this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_start != 0x40) {
      pBVar2 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_78,"\"%s\" expects a single argument as an integer value",
                 &local_79);
      ::std::__cxx11::string::string((string *)&local_58,(string *)loption);
      BinderException::BinderException<std::__cxx11::string>(pBVar2,&local_78,&local_58);
      __cxa_throw(pBVar2,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    value = vector<duckdb::Value,_true>::get<true>(this,0);
  }
  iVar1 = Value::GetValue<long>(value);
  return iVar1;
}

Assistant:

static int64_t ParseInteger(const Value &value, const string &loption) {
	if (value.IsNull()) {
		throw BinderException("\"%s\" expects a non-null integer value", loption);
	}
	if (value.type().id() == LogicalTypeId::LIST) {
		auto &children = ListValue::GetChildren(value);
		if (children.size() != 1) {
			// no option specified or multiple options specified
			throw BinderException("\"%s\" expects a single argument as an integer value", loption);
		}
		return ParseInteger(children[0], loption);
	}
	return value.GetValue<int64_t>();
}